

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O2

void __thiscall Vault::Client::Client(Client *this,Client *other,Token *token)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001c5990;
  iVar1 = (*other->_vptr_Client[4])(other);
  this->debug_ = SUB41(iVar1,0);
  iVar1 = (*other->_vptr_Client[5])(other);
  this->tls_ = SUB41(iVar1,0);
  (*other->_vptr_Client[6])(&this->host_,other);
  (*other->_vptr_Client[7])(&this->port_,other);
  std::__cxx11::string::string((string *)&this->token_,(string *)token);
  (*other->_vptr_Client[9])(&this->namespace_,other);
  iVar1 = (*other->_vptr_Client[10])(other);
  HttpClient::HttpClient(&this->httpClient_,(HttpClient *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*other->_vptr_Client[0xb])(other);
  this->authStrategy_ = (AuthenticationStrategy *)CONCAT44(extraout_var_00,iVar1);
  (*other->_vptr_Client[0xc])(&this->caBundle_,other);
  return;
}

Assistant:

Vault::Client::Client(const Vault::Client &other, Vault::Token token)
    : debug_(other.getDebug())
    , tls_(other.getTls())
    , host_(other.getHost())
    , port_(other.getPort())
    , token_(std::move(token))
    , namespace_(other.getNamespace())
    , httpClient_(other.getHttpClient())
    , authStrategy_(other.getAuthenticationStrategy())
    , caBundle_(other.getCaBundle()) {}